

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ijgp.h
# Opt level: O2

ostream * libDAI::operator<<(ostream *os,Bucket *b)

{
  pointer pBVar1;
  ostream *poVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  size_t bE;
  ulong uVar6;
  bool bVar7;
  
  poVar2 = std::operator<<(os,"Bucket[var = ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,"; factors = {");
  lVar4 = 0;
  lVar3 = 0;
  for (uVar6 = 0;
      pBVar1 = (b->
               super_vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>).
               super__Vector_base<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar6 < (ulong)(((long)(b->
                             super_vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
                             ).
                             super__Vector_base<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1) / 0x30);
      uVar6 = uVar6 + 1) {
    if ((&pBVar1->isFactor)[lVar4] == true) {
      bVar7 = lVar3 == 0;
      pcVar5 = ",";
      lVar3 = lVar3 + 1;
      if (bVar7) {
        pcVar5 = "";
      }
      poVar2 = std::operator<<(os,pcVar5);
      operator<<(poVar2,(VarSet *)
                        ((long)&(((b->
                                  super_vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
                                  ).
                                  super__Vector_base<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->super_VarSet)._vars +
                        lVar4));
    }
    lVar4 = lVar4 + 0x30;
  }
  std::operator<<(os,"}; messages = {");
  lVar4 = 0;
  lVar3 = 0;
  for (uVar6 = 0;
      pBVar1 = (b->
               super_vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>).
               super__Vector_base<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar6 < (ulong)(((long)(b->
                             super_vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
                             ).
                             super__Vector_base<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1) / 0x30);
      uVar6 = uVar6 + 1) {
    if ((&pBVar1->isFactor)[lVar4] == false) {
      bVar7 = lVar3 == 0;
      pcVar5 = ",";
      lVar3 = lVar3 + 1;
      if (bVar7) {
        pcVar5 = "";
      }
      poVar2 = std::operator<<(os,pcVar5);
      operator<<(poVar2,(VarSet *)
                        ((long)&(((b->
                                  super_vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
                                  ).
                                  super__Vector_base<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->super_VarSet)._vars +
                        lVar4));
    }
    lVar4 = lVar4 + 0x30;
  }
  std::operator<<(os,"}]");
  return os;
}

Assistant:

std::ostream & operator << ( std::ostream & os, const Bucket & b ) {
                        os << "Bucket[var = " << b.var << "; factors = {";
                        size_t count = 0;
                        for( size_t bE = 0; bE < b.size(); bE++ )
                            if( b[bE].isFactor )
                                os << ((count++) ? "," : "") << b[bE];
                        os << "}; messages = {";
                        count = 0;
                        for( size_t bE = 0; bE < b.size(); bE++ )
                            if( !b[bE].isFactor )
                                os << ((count++) ? "," : "") << b[bE];
                        os << "}]";

                        return(os);
                    }